

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O1

bool isVt(string *str)

{
  pointer __s1;
  size_t __n;
  int iVar1;
  size_type *psVar2;
  ulong uVar3;
  bool bVar4;
  
  __s1 = (str->_M_dataplus)._M_p;
  __n = str->_M_string_length;
  bVar4 = true;
  psVar2 = &strVt_abi_cxx11_[0]._M_string_length;
  uVar3 = 0;
  do {
    if (__n == *psVar2) {
      if (__n == 0) {
        return bVar4;
      }
      iVar1 = bcmp(__s1,(((string *)(psVar2 + -1))->_M_dataplus)._M_p,__n);
      if (iVar1 == 0) {
        return bVar4;
      }
    }
    bVar4 = uVar3 < 0x1f;
    uVar3 = uVar3 + 1;
    psVar2 = psVar2 + 4;
    if (uVar3 == 0x20) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool isVt(string &str) {
//    int len = strVt->length();//这样算出来的长度永远为1！！！！
    int len = sizeof(strVt) / sizeof(strVt[0]);
    for (int i = 0; i < len; i++) {
        if (str == strVt[i]) {
            return true;
        }
    }
    return false;
}